

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_huf.c
# Opt level: O3

exr_result_t
internal_huf_compress
          (uint64_t *encbytes,void *out,uint64_t outsz,uint16_t *raw,uint64_t nRaw,void *spare,
          uint64_t sparebytes)

{
  undefined1 *puVar1;
  uint64_t *hcode;
  ulong *puVar2;
  ulong *puVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  ulong *puVar10;
  int iVar11;
  long *plVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  uint64_t i;
  uint64_t uVar19;
  uint uVar20;
  int iVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  long lVar26;
  undefined1 *puVar27;
  ulong uVar28;
  int iVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  undefined1 *puVar33;
  undefined1 *puVar34;
  bool bVar35;
  ulong *local_70;
  
  puVar34 = (undefined1 *)0x0;
  if (nRaw == 0) goto LAB_00109a4c;
  if (sparebytes != 0x1c001c || outsz < 0x14) {
    return 3;
  }
  puVar1 = (undefined1 *)((long)out + 0x14);
  puVar33 = (undefined1 *)(outsz + (long)out);
  lVar14 = (long)spare + 0x100010;
  uVar19 = 0;
  memset(spare,0,0x80008);
  do {
    plVar12 = (long *)((long)spare + (ulong)raw[uVar19] * 8);
    *plVar12 = *plVar12 + 1;
    uVar19 = uVar19 + 1;
  } while (nRaw != uVar19);
  hcode = (uint64_t *)((long)spare + 0x80008);
  uVar31 = 0xffffffffffffffff;
  do {
    uVar15 = (int)uVar31 + 1;
    uVar31 = (ulong)uVar15;
  } while (*(long *)((long)spare + uVar31 * 8) == 0);
  if (uVar15 < 0x10001) {
    plVar12 = (long *)((long)spare + (ulong)uVar15 * 8);
    uVar24 = 0;
    uVar6 = 0;
    uVar17 = uVar31;
    do {
      *(int *)("-dev" + (long)spare + uVar17 * 4) = (int)uVar17;
      if (*plVar12 != 0) {
        *(long **)(lVar14 + (ulong)uVar6 * 8) = plVar12;
        uVar6 = uVar6 + 1;
        uVar24 = uVar17 & 0xffffffff;
      }
      uVar17 = uVar17 + 1;
      plVar12 = plVar12 + 1;
    } while ((int)uVar17 != 0x10001);
    uVar20 = (int)uVar24 + 1;
    uVar17 = (ulong)uVar20;
    local_70 = (ulong *)((long)spare + uVar17 * 8);
    *local_70 = 1;
    *(ulong **)((long)spare + (ulong)uVar6 * 8 + 0x100010) = local_70;
    uVar6 = uVar6 + 1;
    if (uVar6 < 2) goto LAB_00109359;
    uVar13 = (ulong)uVar6;
    uVar8 = uVar13 - 2 >> 1;
    uVar24 = uVar13 - 1;
    uVar22 = uVar8;
    do {
      puVar10 = *(ulong **)(lVar14 + uVar22 * 8);
      uVar32 = uVar22;
      while (uVar32 < uVar24 >> 1) {
        uVar23 = uVar32 * 2 + 2;
        puVar2 = *(ulong **)((long)spare + uVar32 * 0x10 + 0x100018);
        puVar3 = *(ulong **)((long)spare + uVar32 * 0x10 + 0x100020);
        uVar28 = uVar32 * 2 + 1;
        uVar4 = *puVar3;
        uVar30 = *puVar2;
        uVar18 = uVar23;
        if (uVar4 == uVar30) {
          uVar18 = uVar28;
        }
        if (puVar3 <= puVar2) {
          uVar18 = uVar23;
        }
        if (uVar4 <= uVar30) {
          uVar28 = uVar18;
        }
        *(undefined8 *)(lVar14 + uVar32 * 8) = *(undefined8 *)(lVar14 + uVar28 * 8);
        uVar32 = uVar28;
      }
      if (((uVar6 & 1) == 0) && (uVar32 == uVar8)) {
        *(undefined8 *)(lVar14 + uVar8 * 8) = *(undefined8 *)(lVar14 + uVar24 * 8);
        uVar32 = uVar24;
      }
      if (uVar22 < uVar32) {
        uVar23 = *puVar10;
        do {
          uVar28 = uVar32 - 1 >> 1;
          puVar2 = *(ulong **)(lVar14 + uVar28 * 8);
          if ((*puVar2 <= uVar23) && (puVar2 <= puVar10 || *puVar2 != uVar23)) break;
          *(ulong **)(lVar14 + uVar32 * 8) = puVar2;
          uVar32 = uVar28;
        } while (uVar22 < uVar28);
      }
      *(ulong **)(lVar14 + uVar32 * 8) = puVar10;
      bVar35 = uVar22 != 0;
      uVar22 = uVar22 - 1;
    } while (bVar35);
    memset(hcode,0,0x80008);
    do {
      lVar5 = *(long *)((long)spare + 0x100010);
      puVar10 = *(ulong **)((long)spare + uVar13 * 8 + 0x100008);
      *(long *)((long)spare + uVar13 * 8 + 0x100008) = lVar5;
      uVar22 = (long)spare + ((uVar13 * 8 + 0x100008) - lVar14);
      lVar25 = (long)uVar22 >> 3;
      uVar24 = lVar25 - 1;
      if (uVar24 < 2) {
        uVar23 = 0;
      }
      else {
        uVar8 = 0;
        do {
          uVar32 = uVar8 * 2 + 2;
          puVar2 = *(ulong **)((long)spare + uVar8 * 0x10 + 0x100018);
          puVar3 = *(ulong **)((long)spare + uVar8 * 0x10 + 0x100020);
          uVar23 = uVar8 * 2 + 1;
          uVar28 = *puVar3;
          uVar4 = *puVar2;
          uVar30 = uVar32;
          if (uVar28 == uVar4) {
            uVar30 = uVar23;
          }
          if (puVar3 <= puVar2) {
            uVar30 = uVar32;
          }
          if (uVar28 <= uVar4) {
            uVar23 = uVar30;
          }
          *(undefined8 *)(lVar14 + uVar8 * 8) = *(undefined8 *)(lVar14 + uVar23 * 8);
          uVar8 = uVar23;
        } while (uVar23 < uVar24 >> 1);
      }
      if (((uVar22 & 8) == 0) && (uVar23 == lVar25 - 2U >> 1)) {
        *(undefined8 *)(lVar14 + uVar23 * 8) =
             *(undefined8 *)((long)spare + uVar23 * 0x10 + 0x100018);
        uVar23 = uVar23 * 2 + 1;
LAB_0010952f:
        uVar24 = *puVar10;
        do {
          uVar22 = uVar23 - 1;
          uVar8 = uVar22 >> 1;
          puVar2 = *(ulong **)(lVar14 + uVar8 * 8);
          if ((*puVar2 <= uVar24) && (puVar2 <= puVar10 || *puVar2 != uVar24)) goto LAB_0010957a;
          *(ulong **)(lVar14 + uVar23 * 8) = puVar2;
          uVar23 = uVar8;
        } while (1 < uVar22);
        uVar23 = 0;
      }
      else {
        if (uVar23 != 0) goto LAB_0010952f;
        uVar23 = 0;
      }
LAB_0010957a:
      *(ulong **)((long)spare + uVar23 * 8 + 0x100010) = puVar10;
      uVar24 = uVar13 - 1;
      lVar25 = *(long *)((long)spare + 0x100010);
      lVar26 = uVar13 * 8 + -8 + lVar14;
      if (1 < uVar24) {
        puVar10 = *(ulong **)(lVar26 + -8);
        *(long *)(lVar26 + -8) = lVar25;
        uVar22 = (lVar26 + -8) - lVar14;
        lVar9 = (long)uVar22 >> 3;
        uVar8 = lVar9 - 1;
        if (uVar8 < 2) {
          uVar28 = 0;
        }
        else {
          uVar32 = 0;
          do {
            uVar23 = uVar32 * 2 + 2;
            puVar2 = *(ulong **)((long)spare + uVar32 * 0x10 + 0x100018);
            puVar3 = *(ulong **)((long)spare + uVar32 * 0x10 + 0x100020);
            uVar28 = uVar32 * 2 + 1;
            uVar4 = *puVar3;
            uVar30 = *puVar2;
            uVar18 = uVar23;
            if (uVar4 == uVar30) {
              uVar18 = uVar28;
            }
            if (puVar3 <= puVar2) {
              uVar18 = uVar23;
            }
            if (uVar4 <= uVar30) {
              uVar28 = uVar18;
            }
            *(undefined8 *)(lVar14 + uVar32 * 8) = *(undefined8 *)(lVar14 + uVar28 * 8);
            uVar32 = uVar28;
          } while (uVar28 < uVar8 >> 1);
        }
        if (((uVar22 & 8) == 0) && (uVar28 == lVar9 - 2U >> 1)) {
          *(undefined8 *)(lVar14 + uVar28 * 8) =
               *(undefined8 *)((long)spare + uVar28 * 0x10 + 0x100018);
          uVar28 = uVar28 * 2 + 1;
LAB_0010966e:
          uVar22 = *puVar10;
          do {
            uVar8 = uVar28 - 1;
            uVar32 = uVar8 >> 1;
            puVar2 = *(ulong **)(lVar14 + uVar32 * 8);
            if ((*puVar2 <= uVar22) && (puVar2 <= puVar10 || *puVar2 != uVar22)) goto LAB_001096ab;
            *(ulong **)(lVar14 + uVar28 * 8) = puVar2;
            uVar28 = uVar32;
          } while (1 < uVar8);
        }
        else if (uVar28 != 0) goto LAB_0010966e;
        uVar28 = 0;
LAB_001096ab:
        *(ulong **)(lVar14 + uVar28 * 8) = puVar10;
      }
      uVar22 = (ulong)(lVar5 - (long)spare) >> 3;
      uVar8 = (ulong)(lVar25 - (long)spare) >> 3;
      plVar12 = (long *)((long)spare + (uVar8 & 0xffffffff) * 8);
      *plVar12 = *plVar12 + *(long *)((long)spare + (uVar22 & 0xffffffff) * 8);
      puVar10 = *(ulong **)(lVar26 + -8);
      if (uVar13 - 2 != 0) {
        uVar32 = *puVar10;
        uVar13 = uVar13 - 2;
        do {
          uVar23 = uVar13 - 1;
          uVar28 = uVar23 >> 1;
          puVar2 = *(ulong **)(lVar14 + uVar28 * 8);
          if ((*puVar2 <= uVar32) && (puVar2 <= puVar10 || *puVar2 != uVar32)) goto LAB_0010971c;
          *(ulong **)(lVar14 + uVar13 * 8) = puVar2;
          uVar13 = uVar28;
        } while (1 < uVar23);
      }
      uVar13 = 0;
LAB_0010971c:
      *(ulong **)(lVar14 + uVar13 * 8) = puVar10;
      do {
        uVar6 = (uint)uVar8;
        uVar13 = uVar8 & 0xffffffff;
        plVar12 = (long *)((long)spare + uVar13 * 8 + 0x80008);
        *plVar12 = *plVar12 + 1;
        uVar8 = (ulong)*(uint *)("-dev" + (long)spare + uVar13 * 4);
      } while (*(uint *)("-dev" + (long)spare + uVar13 * 4) != uVar6);
      *(int *)("-dev" + (long)spare + uVar13 * 4) = (int)uVar22;
      do {
        uVar6 = (uint)uVar22;
        uVar13 = uVar22 & 0xffffffff;
        plVar12 = (long *)((long)spare + uVar13 * 8 + 0x80008);
        *plVar12 = *plVar12 + 1;
        uVar22 = (ulong)*(uint *)("-dev" + (long)spare + uVar13 * 4);
      } while (*(uint *)("-dev" + (long)spare + uVar13 * 4) != uVar6);
      uVar13 = uVar24;
    } while (1 < uVar24);
  }
  else {
    uVar17 = 1;
    local_70 = (ulong *)((long)spare + 8);
    *(undefined8 *)((long)spare + 8) = 1;
    *(ulong **)((long)spare + 0x100010) = local_70;
    uVar20 = 1;
LAB_00109359:
    memset(hcode,0,0x80008);
  }
  hufCanonicalCodeTable(hcode);
  memcpy(spare,hcode,0x80008);
  puVar34 = puVar1;
  if (uVar15 <= uVar20) {
    uVar24 = 0;
    iVar16 = 0;
    do {
      uVar6 = (uint)uVar31;
      uVar13 = *(ulong *)((long)spare + uVar31 * 8) & 0x3f;
      uVar22 = 1;
      if (uVar6 < uVar20 && uVar13 == 0) {
        while (uVar8 = uVar22, (*(byte *)((long)spare + uVar31 * 8 + 8) & 0x3f) == 0) {
          uVar31 = uVar31 + 1;
          uVar8 = uVar22 + 1;
          if ((uVar17 <= uVar31) || (bVar35 = 0x103 < uVar22, uVar22 = uVar8, bVar35)) break;
        }
        uVar6 = (uint)uVar31;
        if (uVar8 < 2) goto LAB_001097f7;
        if (uVar8 < 6) {
          uVar24 = uVar24 << 6 | uVar8 + 0x39;
          if (iVar16 < 2) {
            iVar11 = iVar16 + 6;
          }
          else {
            iVar11 = iVar16 + -2;
            iVar16 = iVar16 + 0xe;
            do {
              iVar29 = iVar16;
              if (puVar33 <= puVar34) {
                return 4;
              }
              *puVar34 = (char)(uVar24 >> ((byte)iVar11 & 0x3f));
              puVar34 = puVar34 + 1;
              iVar16 = iVar29 + -8;
              iVar11 = iVar11 + -8;
            } while (0xf < iVar16);
            iVar11 = iVar29 + -0x10;
          }
        }
        else {
          uVar31 = uVar24 << 6 | 0x3f;
          iVar29 = iVar16 + 6;
          if (1 < iVar16) {
            iVar16 = iVar16 + 0xe;
            do {
              iVar11 = iVar16;
              iVar29 = iVar29 + -8;
              if (puVar33 <= puVar34) {
                return 4;
              }
              *puVar34 = (char)(uVar31 >> ((byte)iVar29 & 0x3f));
              puVar34 = puVar34 + 1;
              iVar16 = iVar11 + -8;
            } while (0xf < iVar16);
            iVar29 = iVar11 + -0x10;
          }
          uVar24 = uVar8 - 6 | uVar31 << 8;
          iVar16 = iVar29 + 8;
          iVar11 = iVar16;
          if (-1 < iVar29) {
            do {
              if (puVar33 <= puVar34) {
                return 4;
              }
              *puVar34 = (char)(uVar24 >> ((byte)iVar29 & 0x3f));
              puVar34 = puVar34 + 1;
              iVar29 = iVar29 + -8;
              bVar35 = 0xf < iVar16;
              iVar11 = iVar16 + -8;
              iVar16 = iVar16 + -8;
            } while (bVar35);
          }
        }
      }
      else {
LAB_001097f7:
        uVar24 = uVar24 << 6 | uVar13;
        iVar11 = iVar16 + 6;
        if (1 < iVar16) {
          iVar16 = iVar16 + 0xe;
          do {
            iVar29 = iVar16;
            iVar11 = iVar11 + -8;
            if (puVar33 <= puVar34) {
              return 4;
            }
            *puVar34 = (char)(uVar24 >> ((byte)iVar11 & 0x3f));
            puVar34 = puVar34 + 1;
            iVar16 = iVar29 + -8;
          } while (0xf < iVar16);
          iVar11 = iVar29 + -0x10;
        }
      }
      iVar16 = iVar11;
      uVar31 = (ulong)(uVar6 + 1);
    } while (uVar6 + 1 <= uVar20);
    if (0 < iVar16) {
      if (puVar33 <= puVar34) {
        return 4;
      }
      *puVar34 = (char)(uVar24 << (8U - (char)iVar16 & 0x3f));
      puVar34 = puVar34 + 1;
    }
  }
  puVar27 = puVar34;
  if (nRaw == 1) {
    puVar10 = (ulong *)((long)spare + (ulong)*raw * 8);
    iVar16 = 0;
    uVar24 = 0;
    iVar11 = 0;
LAB_00109955:
    do {
      uVar31 = *puVar10;
      iVar16 = ((uint)uVar31 & 0x3f) + iVar16;
      uVar24 = uVar31 >> 6 | uVar24 << ((byte)uVar31 & 0x3f);
      iVar29 = iVar16;
      if (7 < iVar16) {
        do {
          if (puVar33 <= puVar27) {
            return 4;
          }
          *puVar27 = (char)(uVar24 >> ((byte)(iVar29 + -8) & 0x3f));
          puVar27 = puVar27 + 1;
          iVar21 = iVar16 + -8;
          bVar35 = 0xf < iVar16;
          iVar16 = iVar21;
          iVar29 = iVar29 + -8;
        } while (bVar35);
      }
      bVar35 = 0 < iVar11;
      iVar11 = iVar11 + -1;
    } while (bVar35);
  }
  else {
    uVar6 = (uint)*local_70 & 0x3f;
    uVar17 = *local_70 >> 6;
    uVar19 = 1;
    uVar24 = 0;
    iVar16 = 0;
    iVar11 = 0;
    uVar31 = (ulong)*raw;
    do {
      uVar22 = (ulong)raw[uVar19];
      if ((iVar11 == 0xff) || ((uint)uVar31 != (uint)raw[uVar19])) {
        uVar13 = *(ulong *)((long)spare + uVar31 * 8);
        uVar7 = (uint)uVar13 & 0x3f;
        if ((int)(uVar6 + 8 + uVar7) < (int)(uVar7 * iVar11)) {
          uVar31 = uVar13 >> 6 | uVar24 << ((byte)uVar13 & 0x3f);
          iVar16 = uVar7 + iVar16;
          iVar29 = iVar16;
          if (7 < iVar16) {
            do {
              if (puVar33 <= puVar27) {
                return 4;
              }
              *puVar27 = (char)(uVar31 >> ((byte)(iVar29 + -8) & 0x3f));
              puVar27 = puVar27 + 1;
              iVar21 = iVar16 + -8;
              bVar35 = 0xf < iVar16;
              iVar16 = iVar21;
              iVar29 = iVar29 + -8;
            } while (bVar35);
          }
          uVar31 = uVar31 << (sbyte)uVar6 | uVar17;
          iVar29 = iVar16 + uVar6;
          iVar16 = iVar29;
          if (7 < iVar29) {
            do {
              if (puVar33 <= puVar27) {
                return 4;
              }
              *puVar27 = (char)(uVar31 >> ((byte)(iVar16 + -8) & 0x3f));
              puVar27 = puVar27 + 1;
              iVar21 = iVar29 + -8;
              bVar35 = 0xf < iVar29;
              iVar29 = iVar21;
              iVar16 = iVar16 + -8;
            } while (bVar35);
          }
          uVar24 = (long)iVar11 | uVar31 << 8;
          iVar16 = iVar29 + 8;
          iVar11 = 0;
          if (-1 < iVar29) {
            iVar29 = iVar29 + 0x10;
            do {
              iVar21 = iVar29;
              iVar16 = iVar16 + -8;
              if (puVar33 <= puVar27) {
                return 4;
              }
              *puVar27 = (char)(uVar24 >> ((byte)iVar16 & 0x3f));
              puVar27 = puVar27 + 1;
              iVar29 = iVar21 + -8;
            } while (0xf < iVar29);
            iVar16 = iVar21 + -0x10;
          }
        }
        else {
          if (-1 < iVar11) {
            do {
              uVar13 = *(ulong *)((long)spare + uVar31 * 8);
              iVar16 = ((uint)uVar13 & 0x3f) + iVar16;
              uVar24 = uVar13 >> 6 | uVar24 << ((byte)uVar13 & 0x3f);
              iVar21 = iVar16;
              iVar29 = iVar16;
              if (7 < iVar16) {
                do {
                  if (puVar33 <= puVar27) {
                    return 4;
                  }
                  *puVar27 = (char)(uVar24 >> ((byte)(iVar29 + -8) & 0x3f));
                  puVar27 = puVar27 + 1;
                  iVar16 = iVar21 + -8;
                  bVar35 = 0xf < iVar21;
                  iVar21 = iVar16;
                  iVar29 = iVar29 + -8;
                } while (bVar35);
              }
              bVar35 = 0 < iVar11;
              iVar11 = iVar11 + -1;
            } while (bVar35);
          }
          iVar11 = 0;
        }
      }
      else {
        iVar11 = iVar11 + 1;
        uVar22 = uVar31;
      }
      uVar19 = uVar19 + 1;
      uVar31 = uVar22;
    } while (uVar19 != nRaw);
    uVar31 = *(ulong *)((long)spare + uVar22 * 8);
    uVar7 = (uint)uVar31 & 0x3f;
    if ((int)(uVar6 + 8 + uVar7) < (int)(uVar7 * iVar11)) {
      uVar31 = uVar31 >> 6 | uVar24 << ((byte)uVar31 & 0x3f);
      iVar16 = uVar7 + iVar16;
      iVar29 = iVar16;
      if (7 < iVar16) {
        do {
          if (puVar33 <= puVar27) {
            return 4;
          }
          *puVar27 = (char)(uVar31 >> ((byte)(iVar29 + -8) & 0x3f));
          puVar27 = puVar27 + 1;
          iVar21 = iVar16 + -8;
          bVar35 = 0xf < iVar16;
          iVar16 = iVar21;
          iVar29 = iVar29 + -8;
        } while (bVar35);
      }
      uVar17 = uVar31 << (sbyte)uVar6 | uVar17;
      iVar29 = iVar16 + uVar6;
      iVar16 = iVar29;
      if (7 < iVar29) {
        do {
          if (puVar33 <= puVar27) {
            return 4;
          }
          *puVar27 = (char)(uVar17 >> ((byte)(iVar16 + -8) & 0x3f));
          puVar27 = puVar27 + 1;
          iVar21 = iVar29 + -8;
          bVar35 = 0xf < iVar29;
          iVar29 = iVar21;
          iVar16 = iVar16 + -8;
        } while (bVar35);
      }
      uVar24 = (long)iVar11 | uVar17 << 8;
      iVar16 = iVar29 + 8;
      if (-1 < iVar29) {
        iVar11 = iVar29 + 0x10;
        do {
          iVar29 = iVar11;
          iVar16 = iVar16 + -8;
          if (puVar33 <= puVar27) {
            return 4;
          }
          *puVar27 = (char)(uVar24 >> ((byte)iVar16 & 0x3f));
          puVar27 = puVar27 + 1;
          iVar11 = iVar29 + -8;
        } while (0xf < iVar11);
        iVar16 = iVar29 + -0x10;
      }
    }
    else if (-1 < iVar11) {
      puVar10 = (ulong *)((long)spare + uVar22 * 8);
      goto LAB_00109955;
    }
  }
  if (iVar16 != 0) {
    if (puVar33 <= puVar27) {
      return 4;
    }
    *puVar27 = (char)(uVar24 << (8U - (char)iVar16 & 0x3f));
  }
  uVar31 = (long)iVar16 + ((long)puVar27 - (long)puVar34) * 8;
  if (uVar31 >> 0x20 != 0) {
    return 4;
  }
  *(char *)out = (char)uVar15;
  *(char *)((long)out + 1) = (char)(uVar15 >> 8);
  *(char *)((long)out + 2) = (char)(uVar15 >> 0x10);
  *(char *)((long)out + 3) = (char)(uVar15 >> 0x18);
  *(char *)((long)out + 4) = (char)uVar20;
  *(char *)((long)out + 5) = (char)(uVar20 >> 8);
  *(char *)((long)out + 6) = (char)(uVar20 >> 0x10);
  *(char *)((long)out + 7) = (char)(uVar20 >> 0x18);
  lVar14 = (long)puVar34 - (long)puVar1;
  *(char *)((long)out + 8) = (char)lVar14;
  *(char *)((long)out + 9) = (char)((ulong)lVar14 >> 8);
  *(char *)((long)out + 10) = (char)((ulong)lVar14 >> 0x10);
  *(char *)((long)out + 0xb) = (char)((ulong)lVar14 >> 0x18);
  *(char *)((long)out + 0xc) = (char)uVar31;
  *(char *)((long)out + 0xd) = (char)(uVar31 >> 8);
  *(char *)((long)out + 0xe) = (char)(uVar31 >> 0x10);
  *(char *)((long)out + 0xf) = (char)(uVar31 >> 0x18);
  puVar34 = puVar34 + ((ulong)((int)uVar31 + 7U >> 3) - (long)out);
  *(undefined4 *)((long)out + 0x10) = 0;
LAB_00109a4c:
  *encbytes = (uint64_t)puVar34;
  return 0;
}

Assistant:

exr_result_t
internal_huf_compress (
    uint64_t*       encbytes,
    void*           out,
    uint64_t        outsz,
    const uint16_t* raw,
    uint64_t        nRaw,
    void*           spare,
    uint64_t        sparebytes)
{
    exr_result_t rv;
    uint64_t*    freq;
    uint32_t*    hlink;
    uint64_t**   fHeap;
    uint64_t*    scode;
    uint32_t     im = 0;
    uint32_t     iM = 0;
    uint32_t     tableLength, nBits, dataLength;
    uint8_t*     dataStart;
    uint8_t*     compressed = (uint8_t*) out;
    uint8_t*     tableStart = compressed + 20;
    uint8_t*     tableEnd   = tableStart;
    uint8_t*     maxcompout = compressed + outsz;

    if (nRaw == 0)
    {
        *encbytes = 0;
        return EXR_ERR_SUCCESS;
    }

    if (outsz < 20) return EXR_ERR_INVALID_ARGUMENT;
    if (sparebytes != internal_exr_huf_compress_spare_bytes ())
        return EXR_ERR_INVALID_ARGUMENT;

    freq  = (uint64_t*) spare;
    scode = freq + HUF_ENCSIZE;
    fHeap = (uint64_t**) (scode + HUF_ENCSIZE);
    hlink = (uint32_t*) (fHeap + HUF_ENCSIZE);

    countFrequencies (freq, raw, nRaw);

    hufBuildEncTable (freq, &im, &iM, hlink, fHeap, scode);

    rv = hufPackEncTable (freq, im, iM, &tableEnd, maxcompout);

    if (rv != EXR_ERR_SUCCESS) return rv;
    tableLength =
        (uint32_t) (((uintptr_t) tableEnd) - ((uintptr_t) tableStart));
    dataStart = tableEnd;

    rv = hufEncode (freq, raw, nRaw, iM, dataStart, maxcompout, &nBits);
    if (rv != EXR_ERR_SUCCESS) return rv;

    dataLength = (nBits + 7) / 8;

    writeUInt (compressed, im);
    writeUInt (compressed + 4, iM);
    writeUInt (compressed + 8, tableLength);
    writeUInt (compressed + 12, nBits);
    writeUInt (compressed + 16, 0); // room for future extensions

    *encbytes =
        (((uintptr_t) dataStart) + ((uintptr_t) dataLength) -
         ((uintptr_t) compressed));
    return EXR_ERR_SUCCESS;
}